

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool write_string_to_file(char *path,char *string)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(path,"w");
  if (__stream != (FILE *)0x0) {
    fputs(string,__stream);
    iVar1 = fclose(__stream);
    return SUB41(iVar1,0);
  }
  iVar1 = fprintf(_stderr,"Failed to write file: %s\n",path);
  return SUB41(iVar1,0);
}

Assistant:

static bool write_string_to_file(const char *path, const char *string)
{
	FILE *file = fopen(path, "w");
	if (!file)
	{
		fprintf(stderr, "Failed to write file: %s\n", path);
		return false;
	}

	fprintf(file, "%s", string);
	fclose(file);
	return true;
}